

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O1

ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> *
getOpenFileImpl<llvm::MemoryBuffer>
          (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
           *__return_storage_ptr__,int FD,Twine *Filename,uint64_t FileSize,uint64_t MapSize,
          int64_t Offset,bool RequiresNullTerminator,bool IsVolatile)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  char *pcVar6;
  int *piVar7;
  ssize_t sVar8;
  undefined8 uVar9;
  _func_int *__buf;
  long lVar10;
  error_code eVar11;
  unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_> Buf;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>_2
  local_90;
  byte local_80;
  undefined1 local_78 [24];
  uid_t uStack_60;
  gid_t local_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  file_type fStack_50;
  perms local_4c;
  dev_t local_48;
  nlink_t nStack_40;
  ino_t local_38;
  
  if (getOpenFileImpl<llvm::MemoryBuffer>(int,llvm::Twine_const&,unsigned_long,unsigned_long,long,bool,bool)
      ::PageSize == '\0') {
    getOpenFileImpl<llvm::MemoryBuffer>();
  }
  if ((MapSize != 0xffffffffffffffff) || (MapSize = FileSize, FileSize != 0xffffffffffffffff))
  goto LAB_00177cba;
  uStack_58 = 0;
  uStack_54 = 0;
  fStack_50 = status_error;
  local_78._16_8_ = (char *)0x0;
  uStack_60 = 0;
  local_5c = 0;
  local_78._0_8_ = (_func_int **)0x0;
  local_78._8_8_ = (error_category *)0x0;
  local_4c = perms_not_known;
  local_48 = 0;
  nStack_40 = 0;
  local_38 = 0;
  eVar11 = llvm::sys::fs::status(FD,(file_status *)local_78);
  if (eVar11._M_value == 0) {
    if ((fStack_50 != regular_file) && (fStack_50 != block_file)) {
      getMemoryBufferForStream
                ((ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
                  *)&local_90.TStorage,FD,Filename);
      llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
      moveConstruct<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
                ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                  *)__return_storage_ptr__,
                 (ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
                  *)&local_90.TStorage);
      if ((local_80 & 1) == 0) {
        if ((AlignedCharArray<8UL,_8UL>)local_90.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer !=
            (AlignedCharArray<8UL,_8UL>)0x0) {
          (**(code **)(*(long *)local_90.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer + 8))();
        }
        local_90.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer =
             (AlignedCharArrayUnion<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
              )(AlignedCharArray<8UL,_8UL>)0x0;
      }
      goto LAB_00177c8b;
    }
    bVar2 = true;
    FileSize = CONCAT44(uStack_54,uStack_58);
  }
  else {
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
    *(int *)&__return_storage_ptr__->field_0 = eVar11._M_value;
    *(error_category **)((long)&__return_storage_ptr__->field_0 + 8) = eVar11._M_cat;
LAB_00177c8b:
    FileSize = 0xffffffffffffffff;
    bVar2 = false;
  }
  MapSize = FileSize;
  if (!bVar2) {
    return __return_storage_ptr__;
  }
LAB_00177cba:
  bVar2 = shouldUseMmap(FD,FileSize,MapSize,Offset,RequiresNullTerminator,
                        getOpenFileImpl<llvm::MemoryBuffer>::PageSize,IsVolatile);
  if (bVar2) {
    local_78._0_8_ = local_78._0_8_ & 0xffffffff00000000;
    local_78._8_8_ = std::_V2::system_category();
    local_90.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer =
         (AlignedCharArrayUnion<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
          )Filename;
    plVar5 = (long *)operator_new(0x30,(NamedBufferAlloc *)&local_90.TStorage);
    *plVar5 = (long)&PTR__MemoryBufferMMapFile_00213dd0;
    iVar3 = llvm::sys::fs::mapped_file_region::alignment();
    iVar4 = llvm::sys::fs::mapped_file_region::alignment();
    llvm::sys::fs::mapped_file_region::mapped_file_region
              ((mapped_file_region *)(plVar5 + 3),FD,readonly,(iVar3 + -1 & Offset) + MapSize,
               -iVar4 & Offset,(error_code *)local_78);
    if (local_78._0_4_ == 0) {
      pcVar6 = llvm::sys::fs::mapped_file_region::const_data((mapped_file_region *)(plVar5 + 3));
      iVar3 = llvm::sys::fs::mapped_file_region::alignment();
      pcVar6 = pcVar6 + (iVar3 + -1 & Offset);
      if ((RequiresNullTerminator) && (pcVar6[MapSize] != '\0')) {
        __assert_fail("(!RequiresNullTerminator || BufEnd[0] == 0) && \"Buffer is not null terminated!\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/MemoryBuffer.cpp"
                      ,0x31,"void llvm::MemoryBuffer::init(const char *, const char *, bool)");
      }
      plVar5[1] = (long)pcVar6;
      plVar5[2] = (long)(pcVar6 + MapSize);
    }
    uVar1 = local_78._0_4_;
    if (local_78._0_4_ == 0) {
      __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 & 0xfe;
      *(long **)&__return_storage_ptr__->field_0 = plVar5;
      plVar5 = (long *)0x0;
    }
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 8))(plVar5);
    }
    if (uVar1 == 0) {
      return __return_storage_ptr__;
    }
  }
  llvm::WritableMemoryBuffer::getNewUninitMemBuffer
            ((WritableMemoryBuffer *)local_78,MapSize,Filename);
  if ((_func_int **)local_78._0_8_ == (_func_int **)0x0) {
    uVar9 = std::_V2::generic_category();
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
    *(undefined4 *)&__return_storage_ptr__->field_0 = 0xc;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = uVar9;
  }
  else {
    __buf = *(_func_int **)(local_78._0_8_ + 8);
    lVar10 = Offset + MapSize;
    do {
      if (MapSize == 0) goto LAB_00177e88;
      piVar7 = __errno_location();
      do {
        *piVar7 = 0;
        sVar8 = pread(FD,__buf,MapSize,lVar10 - MapSize);
        if (sVar8 != -1) {
          if (sVar8 == 0) {
            memset(__buf,0,MapSize);
            iVar3 = 3;
          }
          else {
            MapSize = MapSize - sVar8;
            __buf = __buf + sVar8;
            iVar3 = 0;
          }
          goto LAB_00177e7b;
        }
      } while (*piVar7 == 4);
      iVar3 = *piVar7;
      uVar9 = std::_V2::generic_category();
      __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
      *(int *)&__return_storage_ptr__->field_0 = iVar3;
      *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = uVar9;
      iVar3 = 1;
LAB_00177e7b:
    } while (iVar3 == 0);
    if (iVar3 == 3) {
LAB_00177e88:
      uVar9 = local_78._0_8_;
      __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 & 0xfe;
      local_78._0_8_ = (_func_int **)0x0;
      *(undefined8 *)&__return_storage_ptr__->field_0 = uVar9;
    }
  }
  if ((_func_int **)local_78._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_78._0_8_ + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

static ErrorOr<std::unique_ptr<MB>>
getOpenFileImpl(int FD, const Twine &Filename, uint64_t FileSize,
                uint64_t MapSize, int64_t Offset, bool RequiresNullTerminator,
                bool IsVolatile) {
  static int PageSize = sys::Process::getPageSize();

  // Default is to map the full file.
  if (MapSize == uint64_t(-1)) {
    // If we don't know the file size, use fstat to find out.  fstat on an open
    // file descriptor is cheaper than stat on a random path.
    if (FileSize == uint64_t(-1)) {
      sys::fs::file_status Status;
      std::error_code EC = sys::fs::status(FD, Status);
      if (EC)
        return EC;

      // If this not a file or a block device (e.g. it's a named pipe
      // or character device), we can't trust the size. Create the memory
      // buffer by copying off the stream.
      sys::fs::file_type Type = Status.type();
      if (Type != sys::fs::file_type::regular_file &&
          Type != sys::fs::file_type::block_file)
        return getMemoryBufferForStream(FD, Filename);

      FileSize = Status.getSize();
    }
    MapSize = FileSize;
  }

  if (shouldUseMmap(FD, FileSize, MapSize, Offset, RequiresNullTerminator,
                    PageSize, IsVolatile)) {
    std::error_code EC;
    std::unique_ptr<MB> Result(
        new (NamedBufferAlloc(Filename)) MemoryBufferMMapFile<MB>(
            RequiresNullTerminator, FD, MapSize, Offset, EC));
    if (!EC)
      return std::move(Result);
  }

  auto Buf = WritableMemoryBuffer::getNewUninitMemBuffer(MapSize, Filename);
  if (!Buf) {
    // Failed to create a buffer. The only way it can fail is if
    // new(std::nothrow) returns 0.
    return make_error_code(errc::not_enough_memory);
  }

  char *BufPtr = Buf.get()->getBufferStart();

  size_t BytesLeft = MapSize;
#ifndef HAVE_PREAD
  if (lseek(FD, Offset, SEEK_SET) == -1)
    return std::error_code(errno, std::generic_category());
#endif

  while (BytesLeft) {
#ifdef HAVE_PREAD
    ssize_t NumRead = sys::RetryAfterSignal(-1, ::pread, FD, BufPtr, BytesLeft,
                                            MapSize - BytesLeft + Offset);
#else
    ssize_t NumRead = sys::RetryAfterSignal(-1, ::read, FD, BufPtr, BytesLeft);
#endif
    if (NumRead == -1) {
      // Error while reading.
      return std::error_code(errno, std::generic_category());
    }
    if (NumRead == 0) {
      memset(BufPtr, 0, BytesLeft); // zero-initialize rest of the buffer.
      break;
    }
    BytesLeft -= NumRead;
    BufPtr += NumRead;
  }

  return std::move(Buf);
}